

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *pRVar4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 (*pauVar21) [16];
  byte bVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  float *vertices;
  ulong uVar29;
  ulong uVar30;
  ulong in_R8;
  ulong uVar31;
  Scene *pSVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_11c9;
  ulong local_11c8;
  ulong local_11c0;
  RayQueryContext *local_11b8;
  Scene *local_11b0;
  ulong local_11a8;
  int local_119c;
  undefined1 local_1198 [16];
  long local_1180;
  long local_1178;
  long local_1170;
  long local_1168;
  long local_1160;
  long local_1158;
  undefined1 (*local_1150) [16];
  long local_1148;
  long local_1140;
  RTCFilterFunctionNArguments local_1138;
  float local_1108;
  float local_1104;
  float local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 *local_1068;
  byte local_1060;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar44 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar107 = ZEXT1664(auVar44);
      auVar45 = vmaxss_avx512f(auVar44,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar46 = vmaxss_avx512f(auVar44,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx512vl((undefined1  [16])aVar2,auVar47);
      auVar48._8_4_ = 0x219392ef;
      auVar48._0_8_ = 0x219392ef219392ef;
      auVar48._12_4_ = 0x219392ef;
      uVar33 = vcmpps_avx512vl(auVar47,auVar48,1);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108 = ZEXT1664(auVar47);
      auVar47 = vdivps_avx512vl(auVar47,(undefined1  [16])aVar2);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar6 = (bool)((byte)uVar33 & 1);
      auVar58._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
      bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
      auVar72._8_4_ = 0x3f7ffffa;
      auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar72._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar58,auVar72);
      auVar56._8_4_ = 0x3f800003;
      auVar56._0_8_ = 0x3f8000033f800003;
      auVar56._12_4_ = 0x3f800003;
      auVar48 = vmulps_avx512vl(auVar58,auVar56);
      local_10b8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar109 = ZEXT1664(local_10b8);
      local_10c8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar110 = ZEXT1664(local_10c8);
      local_10d8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar111 = ZEXT1664(local_10d8);
      local_1150 = (undefined1 (*) [16])local_f68;
      auVar47 = vucomiss_avx512f(auVar44);
      local_f98 = auVar47._0_4_;
      vmovshdup_avx(auVar47);
      local_fa8 = vshufps_avx(auVar47,auVar47,0x55);
      auVar97 = ZEXT1664(local_fa8);
      vshufpd_avx(auVar47,auVar47,1);
      local_fb8 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar98 = ZEXT1664(local_fb8);
      local_fc8 = auVar48._0_4_;
      local_fd8 = vshufps_avx(auVar48,auVar48,0x55);
      auVar103 = ZEXT1664(local_fd8);
      local_fe8 = vshufps_avx(auVar48,auVar48,0xaa);
      auVar105 = ZEXT1664(local_fe8);
      vucomiss_avx512f(auVar44);
      vucomiss_avx512f(auVar44);
      uVar79 = auVar45._0_4_;
      local_ff8._4_4_ = uVar79;
      local_ff8._0_4_ = uVar79;
      local_ff8._8_4_ = uVar79;
      local_ff8._12_4_ = uVar79;
      auVar106 = ZEXT1664(local_ff8);
      uVar79 = auVar46._0_4_;
      auVar78 = ZEXT1664(CONCAT412(uVar79,CONCAT48(uVar79,CONCAT44(uVar79,uVar79))));
      local_1158 = 0;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      local_1160 = 0x20;
      local_1168 = 0x40;
      local_1170 = 0x10;
      local_1178 = 0x30;
      local_1180 = 0x50;
      lVar28 = 0x20;
      lVar27 = 0x50;
      lVar25 = 0;
      lVar37 = 0x10;
      lVar39 = 0x30;
      lVar41 = 0x40;
      fVar89 = local_f98;
      fVar92 = local_f98;
      fVar93 = local_f98;
      fVar94 = local_f98;
      fVar99 = local_fc8;
      fVar100 = local_fc8;
      fVar101 = local_fc8;
      fVar102 = local_fc8;
      local_11b8 = context;
      do {
        do {
          do {
            if (local_1150 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar21 = local_1150 + -1;
            local_1150 = local_1150 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar21 + 8));
          uVar33 = *(ulong *)*local_1150;
          do {
            if ((uVar33 & 8) == 0) {
              uVar24 = uVar33 & 0xfffffffffffffff0;
              uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar44._4_4_ = uVar79;
              auVar44._0_4_ = uVar79;
              auVar44._8_4_ = uVar79;
              auVar44._12_4_ = uVar79;
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar25),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar25));
              auVar47 = vsubps_avx512vl(auVar47,auVar109._0_16_);
              auVar45._0_4_ = fVar89 * auVar47._0_4_;
              auVar45._4_4_ = fVar92 * auVar47._4_4_;
              auVar45._8_4_ = fVar93 * auVar47._8_4_;
              auVar45._12_4_ = fVar94 * auVar47._12_4_;
              auVar47 = vmaxps_avx(auVar106._0_16_,auVar45);
              auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar28),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar28));
              auVar48 = vsubps_avx512vl(auVar48,auVar110._0_16_);
              auVar46._0_4_ = auVar97._0_4_ * auVar48._0_4_;
              auVar46._4_4_ = auVar97._4_4_ * auVar48._4_4_;
              auVar46._8_4_ = auVar97._8_4_ * auVar48._8_4_;
              auVar46._12_4_ = auVar97._12_4_ * auVar48._12_4_;
              auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar41),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar41));
              auVar48 = vsubps_avx512vl(auVar48,auVar111._0_16_);
              auVar68._0_4_ = auVar98._0_4_ * auVar48._0_4_;
              auVar68._4_4_ = auVar98._4_4_ * auVar48._4_4_;
              auVar68._8_4_ = auVar98._8_4_ * auVar48._8_4_;
              auVar68._12_4_ = auVar98._12_4_ * auVar48._12_4_;
              auVar48 = vmaxps_avx(auVar46,auVar68);
              local_1098 = vmaxps_avx(auVar47,auVar48);
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar37),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar37));
              auVar47 = vsubps_avx512vl(auVar47,auVar109._0_16_);
              auVar67._0_4_ = fVar99 * auVar47._0_4_;
              auVar67._4_4_ = fVar100 * auVar47._4_4_;
              auVar67._8_4_ = fVar101 * auVar47._8_4_;
              auVar67._12_4_ = fVar102 * auVar47._12_4_;
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar39),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar39));
              auVar47 = vsubps_avx512vl(auVar47,auVar110._0_16_);
              auVar69._0_4_ = auVar103._0_4_ * auVar47._0_4_;
              auVar69._4_4_ = auVar103._4_4_ * auVar47._4_4_;
              auVar69._8_4_ = auVar103._8_4_ * auVar47._8_4_;
              auVar69._12_4_ = auVar103._12_4_ * auVar47._12_4_;
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + lVar27),auVar44,
                                        *(undefined1 (*) [16])(uVar24 + 0x20 + lVar27));
              auVar47 = vsubps_avx512vl(auVar47,auVar111._0_16_);
              auVar57._0_4_ = auVar105._0_4_ * auVar47._0_4_;
              auVar57._4_4_ = auVar105._4_4_ * auVar47._4_4_;
              auVar57._8_4_ = auVar105._8_4_ * auVar47._8_4_;
              auVar57._12_4_ = auVar105._12_4_ * auVar47._12_4_;
              auVar47 = vminps_avx(auVar69,auVar57);
              auVar48 = vminps_avx(auVar78._0_16_,auVar67);
              auVar47 = vminps_avx(auVar48,auVar47);
              uVar8 = vcmpps_avx512vl(local_1098,auVar47,2);
              bVar22 = (byte)uVar8;
              if (((uint)uVar33 & 7) == 6) {
                uVar8 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar24 + 0xf0),1);
                uVar9 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar24 + 0xe0),0xd);
                bVar22 = (byte)uVar8 & (byte)uVar9 & bVar22;
              }
              in_R8 = CONCAT44((int)(in_R8 >> 0x20),(uint)bVar22);
            }
            if ((uVar33 & 8) == 0) {
              if (in_R8 == 0) {
                iVar23 = 4;
              }
              else {
                uVar24 = uVar33 & 0xfffffffffffffff0;
                lVar12 = 0;
                for (uVar33 = in_R8; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  lVar12 = lVar12 + 1;
                }
                iVar23 = 0;
                uVar29 = in_R8 - 1 & in_R8;
                uVar33 = *(ulong *)(uVar24 + lVar12 * 8);
                if (uVar29 != 0) {
                  uVar43 = *(uint *)(local_1098 + lVar12 * 4);
                  lVar12 = 0;
                  for (uVar30 = uVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000
                      ) {
                    lVar12 = lVar12 + 1;
                  }
                  uVar29 = uVar29 - 1 & uVar29;
                  uVar30 = *(ulong *)(uVar24 + lVar12 * 8);
                  uVar26 = *(uint *)(local_1098 + lVar12 * 4);
                  if (uVar29 == 0) {
                    if (uVar43 < uVar26) {
                      *(ulong *)*local_1150 = uVar30;
                      *(uint *)((long)*local_1150 + 8) = uVar26;
                      local_1150 = local_1150 + 1;
                    }
                    else {
                      *(ulong *)*local_1150 = uVar33;
                      *(uint *)((long)*local_1150 + 8) = uVar43;
                      uVar33 = uVar30;
                      local_1150 = local_1150 + 1;
                    }
                  }
                  else {
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar33;
                    auVar47 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar43));
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar30;
                    auVar48 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar26));
                    lVar12 = 0;
                    for (uVar33 = uVar29; (uVar33 & 1) == 0;
                        uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                      lVar12 = lVar12 + 1;
                    }
                    uVar29 = uVar29 - 1 & uVar29;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = *(ulong *)(uVar24 + lVar12 * 8);
                    auVar45 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_1098 + lVar12 * 4)));
                    auVar72 = vpshufd_avx(auVar47,0xaa);
                    auVar56 = vpshufd_avx(auVar48,0xaa);
                    auVar44 = vpshufd_avx(auVar45,0xaa);
                    if (uVar29 == 0) {
                      uVar33 = vpcmpgtd_avx512vl(auVar56,auVar72);
                      uVar33 = uVar33 & 0xf;
                      auVar56 = vpblendmd_avx512vl(auVar48,auVar47);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar55._0_4_ = (uint)bVar6 * auVar56._0_4_ | (uint)!bVar6 * auVar72._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar55._4_4_ = (uint)bVar6 * auVar56._4_4_ | (uint)!bVar6 * auVar72._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar55._8_4_ = (uint)bVar6 * auVar56._8_4_ | (uint)!bVar6 * auVar72._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar55._12_4_ = (uint)bVar6 * auVar56._12_4_ | (uint)!bVar6 * auVar72._12_4_;
                      auVar48 = vmovdqa32_avx512vl(auVar48);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar49._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar49._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vpshufd_avx(auVar55,0xaa);
                      uVar24 = vpcmpgtd_avx512vl(auVar44,auVar47);
                      uVar24 = uVar24 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar45,auVar55);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
                      uVar33 = CONCAT44((uint)bVar7 * auVar48._4_4_ | (uint)!bVar7 * auVar47._4_4_,
                                        (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_);
                      auVar47 = vmovdqa32_avx512vl(auVar45);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar50._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar55._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar50._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar55._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar50._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar55._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar50._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar55._12_4_;
                      auVar47 = vpshufd_avx(auVar50,0xaa);
                      auVar48 = vpshufd_avx(auVar49,0xaa);
                      uVar24 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar24 = uVar24 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar50,auVar49);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar51._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar51._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar51._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar51._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar50);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar52._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar49._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar52._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar49._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar52._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar49._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar52._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar49._12_4_;
                      *local_1150 = auVar52;
                      local_1150[1] = auVar51;
                      local_1150 = local_1150 + 2;
                    }
                    else {
                      lVar12 = 0;
                      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                        lVar12 = lVar12 + 1;
                      }
                      uVar43 = *(uint *)(local_1098 + lVar12 * 4);
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = *(ulong *)(uVar24 + lVar12 * 8);
                      auVar46 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar43));
                      uVar33 = vpcmpgtd_avx512vl(auVar56,auVar72);
                      uVar33 = uVar33 & 0xf;
                      auVar56 = vpblendmd_avx512vl(auVar48,auVar47);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar61._0_4_ = (uint)bVar6 * auVar56._0_4_ | (uint)!bVar6 * auVar72._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar61._4_4_ = (uint)bVar6 * auVar56._4_4_ | (uint)!bVar6 * auVar72._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar61._8_4_ = (uint)bVar6 * auVar56._8_4_ | (uint)!bVar6 * auVar72._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar61._12_4_ = (uint)bVar6 * auVar56._12_4_ | (uint)!bVar6 * auVar72._12_4_;
                      auVar48 = vmovdqa32_avx512vl(auVar48);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar62._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar62._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar62._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar62._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar81._4_4_ = uVar43;
                      auVar81._0_4_ = uVar43;
                      auVar81._8_4_ = uVar43;
                      auVar81._12_4_ = uVar43;
                      uVar33 = vpcmpgtd_avx512vl(auVar81,auVar44);
                      uVar33 = uVar33 & 0xf;
                      auVar47 = vpblendmd_avx512vl(auVar46,auVar45);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar64._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * uVar43;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar64._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * uVar43;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar64._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * uVar43;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar64._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * uVar43;
                      auVar47 = vmovdqa32_avx512vl(auVar46);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar65._0_4_ = (uint)bVar6 * auVar47._0_4_ | (uint)!bVar6 * auVar45._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar65._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar45._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar65._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * auVar45._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar65._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * auVar45._12_4_;
                      auVar47 = vpshufd_avx(auVar65,0xaa);
                      auVar48 = vpshufd_avx(auVar62,0xaa);
                      uVar33 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar33 = uVar33 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar65,auVar62);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar66._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar66._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar66._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar66._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar65);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar70._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar62._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar70._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar62._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar70._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar62._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar70._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar62._12_4_;
                      auVar47 = vpshufd_avx(auVar64,0xaa);
                      auVar48 = vpshufd_avx(auVar61,0xaa);
                      uVar24 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar24 = uVar24 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar64,auVar61);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
                      uVar33 = CONCAT44((uint)bVar7 * auVar48._4_4_ | (uint)!bVar7 * auVar47._4_4_,
                                        (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_);
                      auVar47 = vmovdqa32_avx512vl(auVar64);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar71._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar61._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar71._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar61._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar71._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar61._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar71._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar61._12_4_;
                      auVar47 = vpshufd_avx(auVar71,0xaa);
                      auVar48 = vpshufd_avx(auVar66,0xaa);
                      uVar24 = vpcmpgtd_avx512vl(auVar48,auVar47);
                      uVar24 = uVar24 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar66,auVar71);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar53._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar53._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar53._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar53._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar66);
                      bVar6 = (bool)((byte)uVar24 & 1);
                      auVar54._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar71._0_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                      auVar54._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar71._4_4_;
                      bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                      auVar54._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar71._8_4_;
                      bVar6 = SUB81(uVar24 >> 3,0);
                      auVar54._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar71._12_4_;
                      *local_1150 = auVar70;
                      local_1150[1] = auVar54;
                      local_1150[2] = auVar53;
                      local_1150 = local_1150 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar23 = 6;
            }
          } while (iVar23 == 0);
        } while (iVar23 != 6);
        local_1148 = (ulong)((uint)uVar33 & 0xf) - 8;
        local_11c0 = in_R8;
        if (local_1148 != 0) {
          uVar33 = uVar33 & 0xfffffffffffffff0;
          pSVar32 = context->scene;
          local_1140 = 0;
          local_11c8 = uVar33;
          local_11b0 = pSVar32;
          do {
            lVar25 = local_1140 * 0x50;
            pGVar3 = (pSVar32->geometries).items[*(uint *)(uVar33 + 0x30 + lVar25)].ptr;
            fVar89 = (pGVar3->time_range).lower;
            fVar89 = pGVar3->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar89) /
                     ((pGVar3->time_range).upper - fVar89));
            auVar47 = vroundss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),9);
            auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
            auVar55 = vmaxss_avx512f(auVar107._0_16_,auVar47);
            lVar27 = (long)(int)auVar55._0_4_ * 0x38;
            uVar29 = CONCAT44(0,*(uint *)(uVar33 + lVar25));
            local_1198._0_8_ = uVar29;
            local_11a8 = (ulong)*(uint *)(uVar33 + 4 + lVar25);
            lVar28 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar27);
            auVar47 = *(undefined1 (*) [16])(lVar28 + uVar29 * 4);
            uVar30 = (ulong)*(uint *)(uVar33 + 0x10 + lVar25);
            auVar48 = *(undefined1 (*) [16])(lVar28 + uVar30 * 4);
            lVar27 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar27);
            uVar31 = (ulong)*(uint *)(uVar33 + 0x20 + lVar25);
            auVar72 = *(undefined1 (*) [16])(lVar28 + uVar31 * 4);
            auVar56 = *(undefined1 (*) [16])(lVar28 + local_11a8 * 4);
            uVar34 = (ulong)*(uint *)(local_11c8 + 0x14 + lVar25);
            auVar44 = *(undefined1 (*) [16])(lVar28 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(local_11c8 + 0x24 + lVar25);
            auVar45 = *(undefined1 (*) [16])(lVar28 + uVar35 * 4);
            uVar36 = (ulong)*(uint *)(local_11c8 + 8 + lVar25);
            auVar46 = *(undefined1 (*) [16])(lVar28 + uVar36 * 4);
            uVar33 = (ulong)*(uint *)(local_11c8 + 0x18 + lVar25);
            auVar58 = *(undefined1 (*) [16])(lVar28 + uVar33 * 4);
            uVar42 = (ulong)*(uint *)(local_11c8 + 0x28 + lVar25);
            auVar67 = *(undefined1 (*) [16])(lVar28 + uVar42 * 4);
            uVar38 = (ulong)*(uint *)(local_11c8 + 0xc + lVar25);
            auVar68 = *(undefined1 (*) [16])(lVar28 + uVar38 * 4);
            uVar40 = (ulong)*(uint *)(local_11c8 + 0x1c + lVar25);
            auVar69 = *(undefined1 (*) [16])(lVar28 + uVar40 * 4);
            uVar24 = (ulong)*(uint *)(local_11c8 + 0x2c + lVar25);
            auVar57 = *(undefined1 (*) [16])(lVar28 + uVar24 * 4);
            auVar59 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
            auVar60 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
            auVar61 = *(undefined1 (*) [16])(lVar27 + local_11a8 * 4);
            auVar62 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar27 + uVar35 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
            auVar66 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar27 + uVar42 * 4);
            auVar71 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar27 + uVar40 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar27 + uVar24 * 4);
            puVar1 = (undefined8 *)(local_11c8 + 0x30 + lVar25);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(local_11c8 + 0x40 + lVar25);
            auVar81 = vunpcklps_avx(auVar47,auVar46);
            auVar47 = vunpckhps_avx(auVar47,auVar46);
            auVar46 = vunpcklps_avx(auVar56,auVar68);
            auVar56 = vunpckhps_avx(auVar56,auVar68);
            auVar68 = vunpcklps_avx(auVar47,auVar56);
            auVar86 = vunpcklps_avx(auVar81,auVar46);
            auVar47 = vunpckhps_avx(auVar81,auVar46);
            auVar46 = vunpcklps_avx(auVar48,auVar58);
            auVar48 = vunpckhps_avx(auVar48,auVar58);
            auVar58 = vunpcklps_avx(auVar44,auVar69);
            auVar56 = vunpckhps_avx(auVar44,auVar69);
            auVar44 = vunpcklps_avx(auVar48,auVar56);
            auVar69 = vunpcklps_avx(auVar46,auVar58);
            auVar48 = vunpckhps_avx(auVar46,auVar58);
            auVar46 = vunpcklps_avx(auVar72,auVar67);
            auVar72 = vunpckhps_avx(auVar72,auVar67);
            auVar58 = vunpcklps_avx(auVar45,auVar57);
            auVar56 = vunpckhps_avx(auVar45,auVar57);
            auVar45 = vunpcklps_avx(auVar72,auVar56);
            auVar67 = vunpcklps_avx(auVar46,auVar58);
            auVar72 = vunpckhps_avx(auVar46,auVar58);
            auVar56 = vunpcklps_avx512vl(auVar59,auVar65);
            auVar46 = vunpckhps_avx512vl(auVar59,auVar65);
            auVar57 = vunpcklps_avx512vl(auVar61,auVar71);
            auVar58 = vunpckhps_avx512vl(auVar61,auVar71);
            auVar46 = vunpcklps_avx(auVar46,auVar58);
            auVar58 = vunpcklps_avx(auVar56,auVar57);
            auVar56 = vunpckhps_avx(auVar56,auVar57);
            auVar57 = vunpcklps_avx512vl(auVar60,auVar66);
            auVar59 = vunpckhps_avx512vl(auVar60,auVar66);
            auVar60 = vunpcklps_avx512vl(auVar62,auVar53);
            auVar61 = vunpckhps_avx512vl(auVar62,auVar53);
            auVar59 = vunpcklps_avx512vl(auVar59,auVar61);
            auVar61 = vunpcklps_avx512vl(auVar57,auVar60);
            auVar60 = vunpckhps_avx512vl(auVar57,auVar60);
            auVar62 = vunpcklps_avx512vl(auVar63,auVar70);
            auVar57 = vunpckhps_avx512vl(auVar63,auVar70);
            auVar63 = vunpcklps_avx512vl(auVar64,auVar54);
            auVar64 = vunpckhps_avx512vl(auVar64,auVar54);
            auVar57 = vunpcklps_avx(auVar57,auVar64);
            auVar64 = vunpcklps_avx512vl(auVar62,auVar63);
            auVar63 = vunpckhps_avx512vl(auVar62,auVar63);
            auVar65 = ZEXT416((uint)(fVar89 - auVar55._0_4_));
            auVar62 = vbroadcastss_avx512vl(auVar65);
            auVar65 = vsubss_avx512f(ZEXT416(0x3f800000),auVar65);
            auVar74._0_4_ = auVar65._0_4_;
            auVar74._4_4_ = auVar74._0_4_;
            auVar74._8_4_ = auVar74._0_4_;
            auVar74._12_4_ = auVar74._0_4_;
            auVar58 = vmulps_avx512vl(auVar62,auVar58);
            auVar65 = vmulps_avx512vl(auVar62,auVar56);
            auVar66 = vmulps_avx512vl(auVar62,auVar46);
            auVar56 = vfmadd231ps_fma(auVar58,auVar74,auVar86);
            auVar46 = vfmadd231ps_fma(auVar65,auVar74,auVar47);
            auVar58 = vfmadd231ps_fma(auVar66,auVar74,auVar68);
            auVar47 = vmulps_avx512vl(auVar62,auVar61);
            auVar60 = vmulps_avx512vl(auVar62,auVar60);
            auVar59 = vmulps_avx512vl(auVar62,auVar59);
            auVar68 = vfmadd231ps_fma(auVar47,auVar74,auVar69);
            auVar69 = vfmadd231ps_fma(auVar60,auVar74,auVar48);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar74,auVar44);
            auVar47 = vmulps_avx512vl(auVar62,auVar64);
            auVar48 = vmulps_avx512vl(auVar62,auVar63);
            auVar57 = vmulps_avx512vl(auVar62,auVar57);
            auVar44 = vfmadd231ps_fma(auVar47,auVar74,auVar67);
            auVar72 = vfmadd231ps_fma(auVar48,auVar74,auVar72);
            local_10a8 = *puVar1;
            uStack_10a0 = puVar1[1];
            auVar45 = vfmadd231ps_fma(auVar57,auVar74,auVar45);
            local_11c9 = 0;
            uVar79 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar75._4_4_ = uVar79;
            auVar75._0_4_ = uVar79;
            auVar75._8_4_ = uVar79;
            auVar75._12_4_ = uVar79;
            uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar80._4_4_ = uVar79;
            auVar80._0_4_ = uVar79;
            auVar80._8_4_ = uVar79;
            auVar80._12_4_ = uVar79;
            auVar67 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar79 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar84._4_4_ = uVar79;
            auVar84._0_4_ = uVar79;
            auVar84._8_4_ = uVar79;
            auVar84._12_4_ = uVar79;
            uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar87._4_4_ = uVar79;
            auVar87._0_4_ = uVar79;
            auVar87._8_4_ = uVar79;
            auVar87._12_4_ = uVar79;
            local_1068 = &local_11c9;
            fVar89 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar90._4_4_ = fVar89;
            auVar90._0_4_ = fVar89;
            auVar90._8_4_ = fVar89;
            auVar90._12_4_ = fVar89;
            auVar47 = vsubps_avx(auVar56,auVar75);
            auVar48 = vsubps_avx(auVar46,auVar80);
            auVar46 = vsubps_avx512vl(auVar58,auVar67);
            auVar58 = vsubps_avx512vl(auVar68,auVar75);
            auVar68 = vsubps_avx512vl(auVar69,auVar80);
            auVar69 = vsubps_avx512vl(auVar59,auVar67);
            auVar57 = vsubps_avx512vl(auVar44,auVar75);
            auVar72 = vsubps_avx(auVar72,auVar80);
            auVar45 = vsubps_avx512vl(auVar45,auVar67);
            auVar67 = vsubps_avx512vl(auVar57,auVar47);
            auVar56 = vsubps_avx(auVar72,auVar48);
            auVar59 = vsubps_avx512vl(auVar45,auVar46);
            auVar60 = vsubps_avx512vl(auVar47,auVar58);
            auVar63 = vsubps_avx512vl(auVar48,auVar68);
            auVar61 = vsubps_avx512vl(auVar46,auVar69);
            auVar62 = vsubps_avx512vl(auVar58,auVar57);
            auVar64 = vsubps_avx512vl(auVar68,auVar72);
            auVar65 = vsubps_avx512vl(auVar69,auVar45);
            auVar44 = vaddps_avx512vl(auVar57,auVar47);
            auVar95._0_4_ = auVar72._0_4_ + auVar48._0_4_;
            auVar95._4_4_ = auVar72._4_4_ + auVar48._4_4_;
            auVar95._8_4_ = auVar72._8_4_ + auVar48._8_4_;
            auVar95._12_4_ = auVar72._12_4_ + auVar48._12_4_;
            auVar66 = vaddps_avx512vl(auVar45,auVar46);
            auVar70 = vmulps_avx512vl(auVar95,auVar59);
            auVar70 = vfmsub231ps_avx512vl(auVar70,auVar56,auVar66);
            auVar66 = vmulps_avx512vl(auVar66,auVar67);
            auVar66 = vfmsub231ps_avx512vl(auVar66,auVar59,auVar44);
            auVar82._0_4_ = auVar56._0_4_ * auVar44._0_4_;
            auVar82._4_4_ = auVar56._4_4_ * auVar44._4_4_;
            auVar82._8_4_ = auVar56._8_4_ * auVar44._8_4_;
            auVar82._12_4_ = auVar56._12_4_ * auVar44._12_4_;
            auVar44 = vfmsub231ps_fma(auVar82,auVar67,auVar95);
            auVar83._0_4_ = fVar89 * auVar44._0_4_;
            auVar83._4_4_ = fVar89 * auVar44._4_4_;
            auVar83._8_4_ = fVar89 * auVar44._8_4_;
            auVar83._12_4_ = fVar89 * auVar44._12_4_;
            auVar44 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar66);
            local_1098 = vfmadd231ps_avx512vl(auVar44,auVar84,auVar70);
            auVar44 = vaddps_avx512vl(auVar47,auVar58);
            auVar66 = vaddps_avx512vl(auVar48,auVar68);
            auVar70 = vaddps_avx512vl(auVar46,auVar69);
            auVar71 = vmulps_avx512vl(auVar66,auVar61);
            auVar71 = vfmsub231ps_avx512vl(auVar71,auVar63,auVar70);
            auVar70 = vmulps_avx512vl(auVar70,auVar60);
            auVar70 = vfmsub231ps_avx512vl(auVar70,auVar61,auVar44);
            auVar44 = vmulps_avx512vl(auVar44,auVar63);
            auVar44 = vfmsub231ps_avx512vl(auVar44,auVar60,auVar66);
            auVar96._0_4_ = fVar89 * auVar44._0_4_;
            auVar96._4_4_ = fVar89 * auVar44._4_4_;
            auVar96._8_4_ = fVar89 * auVar44._8_4_;
            auVar96._12_4_ = fVar89 * auVar44._12_4_;
            auVar44 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar70);
            local_1088 = vfmadd231ps_avx512vl(auVar44,auVar84,auVar71);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar78 = ZEXT1664(auVar44);
            auVar58 = vaddps_avx512vl(auVar58,auVar57);
            auVar72 = vaddps_avx512vl(auVar68,auVar72);
            auVar45 = vaddps_avx512vl(auVar69,auVar45);
            auVar68 = vmulps_avx512vl(auVar72,auVar65);
            auVar68 = vfmsub231ps_avx512vl(auVar68,auVar64,auVar45);
            auVar45 = vmulps_avx512vl(auVar45,auVar62);
            auVar45 = vfmsub231ps_avx512vl(auVar45,auVar65,auVar58);
            auVar58 = vmulps_avx512vl(auVar58,auVar64);
            auVar72 = vfmsub231ps_avx512vl(auVar58,auVar62,auVar72);
            auVar72 = vmulps_avx512vl(auVar90,auVar72);
            auVar72 = vfmadd231ps_avx512vl(auVar72,auVar87,auVar45);
            auVar72 = vfmadd231ps_avx512vl(auVar72,auVar84,auVar68);
            auVar104._0_4_ = local_1088._0_4_ + local_1098._0_4_;
            auVar104._4_4_ = local_1088._4_4_ + local_1098._4_4_;
            auVar104._8_4_ = local_1088._8_4_ + local_1098._8_4_;
            auVar104._12_4_ = local_1088._12_4_ + local_1098._12_4_;
            local_1078 = vaddps_avx512vl(auVar72,auVar104);
            auVar13._8_4_ = 0x7fffffff;
            auVar13._0_8_ = 0x7fffffff7fffffff;
            auVar13._12_4_ = 0x7fffffff;
            auVar45 = vandps_avx512vl(local_1078,auVar13);
            auVar14._8_4_ = 0x34000000;
            auVar14._0_8_ = 0x3400000034000000;
            auVar14._12_4_ = 0x34000000;
            auVar58 = vmulps_avx512vl(auVar45,auVar14);
            auVar68 = vminps_avx512vl(local_1098,local_1088);
            auVar68 = vminps_avx512vl(auVar68,auVar72);
            auVar15._8_4_ = 0x80000000;
            auVar15._0_8_ = 0x8000000080000000;
            auVar15._12_4_ = 0x80000000;
            auVar69 = vxorps_avx512vl(auVar58,auVar15);
            uVar8 = vcmpps_avx512vl(auVar68,auVar69,5);
            auVar68 = vmaxps_avx512vl(local_1098,local_1088);
            auVar72 = vmaxps_avx512vl(auVar68,auVar72);
            uVar9 = vcmpps_avx512vl(auVar72,auVar58,2);
            local_1060 = ((byte)uVar8 | (byte)uVar9) & 0xf;
            context = local_11b8;
            pSVar32 = local_11b0;
            uVar33 = local_11c8;
            if (local_1060 != 0) {
              auVar72 = vmulps_avx512vl(auVar59,auVar63);
              auVar58 = vmulps_avx512vl(auVar67,auVar61);
              auVar68 = vmulps_avx512vl(auVar56,auVar60);
              auVar69 = vmulps_avx512vl(auVar61,auVar64);
              auVar57 = vmulps_avx512vl(auVar60,auVar65);
              auVar66 = vmulps_avx512vl(auVar63,auVar62);
              auVar56 = vfmsub213ps_avx512vl(auVar56,auVar61,auVar72);
              auVar59 = vfmsub213ps_avx512vl(auVar59,auVar60,auVar58);
              auVar67 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar68);
              auVar63 = vfmsub213ps_avx512vl(auVar65,auVar63,auVar69);
              auVar61 = vfmsub213ps_avx512vl(auVar62,auVar61,auVar57);
              auVar60 = vfmsub213ps_avx512vl(auVar64,auVar60,auVar66);
              auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar72 = vandps_avx512vl(auVar72,auVar62);
              auVar69 = vandps_avx512vl(auVar69,auVar62);
              uVar24 = vcmpps_avx512vl(auVar72,auVar69,1);
              auVar72 = vandps_avx512vl(auVar58,auVar62);
              auVar58 = vandps_avx512vl(auVar57,auVar62);
              uVar29 = vcmpps_avx512vl(auVar72,auVar58,1);
              auVar72 = vandps_avx512vl(auVar68,auVar62);
              auVar58 = vandps_avx512vl(auVar66,auVar62);
              uVar30 = vcmpps_avx512vl(auVar72,auVar58,1);
              bVar6 = (bool)((byte)uVar24 & 1);
              local_1028._0_4_ = (uint)bVar6 * auVar56._0_4_ | (uint)!bVar6 * auVar63._0_4_;
              bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
              local_1028._4_4_ = (uint)bVar6 * auVar56._4_4_ | (uint)!bVar6 * auVar63._4_4_;
              bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
              local_1028._8_4_ = (uint)bVar6 * auVar56._8_4_ | (uint)!bVar6 * auVar63._8_4_;
              bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
              local_1028._12_4_ = (uint)bVar6 * auVar56._12_4_ | (uint)!bVar6 * auVar63._12_4_;
              bVar6 = (bool)((byte)uVar29 & 1);
              local_1018._0_4_ = (uint)bVar6 * auVar59._0_4_ | (uint)!bVar6 * auVar61._0_4_;
              bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
              local_1018._4_4_ = (uint)bVar6 * auVar59._4_4_ | (uint)!bVar6 * auVar61._4_4_;
              bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
              local_1018._8_4_ = (uint)bVar6 * auVar59._8_4_ | (uint)!bVar6 * auVar61._8_4_;
              bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
              local_1018._12_4_ = (uint)bVar6 * auVar59._12_4_ | (uint)!bVar6 * auVar61._12_4_;
              bVar6 = (bool)((byte)uVar30 & 1);
              local_1008[0] = (float)((uint)bVar6 * auVar67._0_4_ | (uint)!bVar6 * auVar60._0_4_);
              bVar6 = (bool)((byte)(uVar30 >> 1) & 1);
              local_1008[1] = (float)((uint)bVar6 * auVar67._4_4_ | (uint)!bVar6 * auVar60._4_4_);
              bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
              local_1008[2] = (float)((uint)bVar6 * auVar67._8_4_ | (uint)!bVar6 * auVar60._8_4_);
              bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
              local_1008[3] = (float)((uint)bVar6 * auVar67._12_4_ | (uint)!bVar6 * auVar60._12_4_);
              auVar91._0_4_ = fVar89 * local_1008[0];
              auVar91._4_4_ = fVar89 * local_1008[1];
              auVar91._8_4_ = fVar89 * local_1008[2];
              auVar91._12_4_ = fVar89 * local_1008[3];
              auVar72 = vfmadd213ps_fma(auVar87,local_1018,auVar91);
              auVar72 = vfmadd213ps_fma(auVar84,local_1028,auVar72);
              auVar85._0_4_ = auVar72._0_4_ + auVar72._0_4_;
              auVar85._4_4_ = auVar72._4_4_ + auVar72._4_4_;
              auVar85._8_4_ = auVar72._8_4_ + auVar72._8_4_;
              auVar85._12_4_ = auVar72._12_4_ + auVar72._12_4_;
              auVar88._0_4_ = auVar46._0_4_ * local_1008[0];
              auVar88._4_4_ = auVar46._4_4_ * local_1008[1];
              auVar88._8_4_ = auVar46._8_4_ * local_1008[2];
              auVar88._12_4_ = auVar46._12_4_ * local_1008[3];
              auVar48 = vfmadd213ps_fma(auVar48,local_1018,auVar88);
              auVar48 = vfmadd213ps_fma(auVar47,local_1028,auVar48);
              auVar47 = vrcp14ps_avx512vl(auVar85);
              auVar56 = auVar108._0_16_;
              auVar72 = vfnmadd213ps_avx512vl(auVar47,auVar85,auVar56);
              auVar47 = vfmadd132ps_fma(auVar72,auVar47,auVar47);
              local_1038._0_4_ = (auVar48._0_4_ + auVar48._0_4_) * auVar47._0_4_;
              local_1038._4_4_ = (auVar48._4_4_ + auVar48._4_4_) * auVar47._4_4_;
              local_1038._8_4_ = (auVar48._8_4_ + auVar48._8_4_) * auVar47._8_4_;
              local_1038._12_4_ = (auVar48._12_4_ + auVar48._12_4_) * auVar47._12_4_;
              auVar97 = ZEXT1664(local_1038);
              uVar79 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar16._4_4_ = uVar79;
              auVar16._0_4_ = uVar79;
              auVar16._8_4_ = uVar79;
              auVar16._12_4_ = uVar79;
              uVar8 = vcmpps_avx512vl(local_1038,auVar16,0xd);
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar47 = vxorps_avx512vl(auVar85,auVar17);
              fVar89 = (ray->super_RayK<1>).tfar;
              auVar18._4_4_ = fVar89;
              auVar18._0_4_ = fVar89;
              auVar18._8_4_ = fVar89;
              auVar18._12_4_ = fVar89;
              uVar9 = vcmpps_avx512vl(local_1038,auVar18,2);
              uVar10 = vcmpps_avx512vl(auVar85,auVar47,4);
              local_1060 = (byte)uVar8 & (byte)uVar9 & (byte)uVar10 & local_1060;
              uVar43 = (uint)local_1060;
              if (local_1060 != 0) {
                auVar19._8_4_ = 0x219392ef;
                auVar19._0_8_ = 0x219392ef219392ef;
                auVar19._12_4_ = 0x219392ef;
                uVar24 = vcmpps_avx512vl(auVar45,auVar19,5);
                auVar47 = vrcp14ps_avx512vl(local_1078);
                auVar48 = vfnmadd213ps_avx512vl(local_1078,auVar47,auVar56);
                auVar47 = vfmadd132ps_avx512vl(auVar48,auVar47,auVar47);
                fVar89 = (float)((uint)((byte)uVar24 & 1) * auVar47._0_4_);
                fVar92 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar47._4_4_);
                fVar93 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar47._8_4_);
                fVar94 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar47._12_4_);
                auVar76._0_4_ = fVar89 * local_1098._0_4_;
                auVar76._4_4_ = fVar92 * local_1098._4_4_;
                auVar76._8_4_ = fVar93 * local_1098._8_4_;
                auVar76._12_4_ = fVar94 * local_1098._12_4_;
                local_1058 = vminps_avx512vl(auVar76,auVar56);
                auVar77._0_4_ = fVar89 * local_1088._0_4_;
                auVar77._4_4_ = fVar92 * local_1088._4_4_;
                auVar77._8_4_ = fVar93 * local_1088._8_4_;
                auVar77._12_4_ = fVar94 * local_1088._12_4_;
                local_1048 = vminps_avx512vl(auVar77,auVar56);
                auVar47 = vblendmps_avx512vl(auVar44,local_1038);
                auVar73._0_4_ =
                     (uint)(local_1060 & 1) * auVar47._0_4_ |
                     (uint)!(bool)(local_1060 & 1) * local_1048._0_4_;
                bVar6 = (bool)(local_1060 >> 1 & 1);
                auVar73._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * local_1048._4_4_;
                bVar6 = (bool)(local_1060 >> 2 & 1);
                auVar73._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * local_1048._8_4_;
                auVar73._12_4_ =
                     (uint)(local_1060 >> 3) * auVar47._12_4_ |
                     (uint)!(bool)(local_1060 >> 3) * local_1048._12_4_;
                auVar47 = vshufps_avx(auVar73,auVar73,0xb1);
                auVar47 = vminps_avx(auVar47,auVar73);
                auVar48 = vshufpd_avx(auVar47,auVar47,1);
                auVar47 = vminps_avx(auVar48,auVar47);
                uVar8 = vcmpps_avx512vl(auVar73,auVar47,0);
                bVar22 = (byte)uVar8 & local_1060;
                if (((byte)uVar8 & local_1060) == 0) {
                  bVar22 = local_1060;
                }
                uVar24 = 0;
                for (uVar29 = (ulong)bVar22; (uVar29 & 1) == 0;
                    uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                  uVar24 = uVar24 + 1;
                }
                do {
                  auVar48 = auVar107._0_16_;
                  uVar26 = *(uint *)((long)&local_f88 + uVar24 * 4);
                  pGVar3 = (pSVar32->geometries).items[uVar26].ptr;
                  auVar47 = auVar73;
                  if ((pGVar3->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar22 = ~(byte)(1 << ((uint)uVar24 & 0x1f)) & (byte)uVar43;
LAB_01f4a840:
                    uVar43 = (uint)bVar22;
                    bVar6 = true;
                  }
                  else {
                    pRVar4 = context->args;
                    if ((pRVar4->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_1138.context = context->user;
                      local_1108 = *(float *)(local_1028 + uVar24 * 4);
                      local_1104 = local_1008[uVar24 - 4];
                      local_1100 = local_1008[uVar24];
                      local_10fc = *(undefined4 *)(local_1058 + uVar24 * 4);
                      local_10f8 = *(undefined4 *)(local_1048 + uVar24 * 4);
                      local_10f4 = *(undefined4 *)((long)&local_10a8 + uVar24 * 4);
                      local_10f0 = uVar26;
                      local_10ec = (local_1138.context)->instID[0];
                      local_10e8 = (local_1138.context)->instPrimID[0];
                      local_11a8 = CONCAT44(local_11a8._4_4_,(ray->super_RayK<1>).tfar);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar24 * 4);
                      local_119c = -1;
                      local_1138.valid = &local_119c;
                      local_1138.geometryUserPtr = pGVar3->userPtr;
                      local_1138.ray = (RTCRayN *)ray;
                      local_1138.hit = (RTCHitN *)&local_1108;
                      local_1138.N = 1;
                      local_1198 = auVar97._0_16_;
                      if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f4aa00:
                        auVar47 = auVar107._0_16_;
                        if (pRVar4->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar4->filter)(&local_1138);
                            auVar97 = ZEXT1664(local_1198);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar78 = ZEXT1664(auVar48);
                            auVar111 = ZEXT1664(local_10d8);
                            auVar110 = ZEXT1664(local_10c8);
                            auVar109 = ZEXT1664(local_10b8);
                            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar108 = ZEXT1664(auVar48);
                            auVar47 = vxorps_avx512vl(auVar47,auVar47);
                            auVar107 = ZEXT1664(auVar47);
                            context = local_11b8;
                            pSVar32 = local_11b0;
                            uVar33 = local_11c8;
                          }
                          if (*local_1138.valid == 0) goto LAB_01f4aad3;
                        }
                        (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1138.hit;
                        (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1138.hit + 4);
                        (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1138.hit + 8);
                        *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                        fVar89 = *(float *)(local_1138.hit + 0x10);
                        *(float *)((long)local_1138.ray + 0x40) = fVar89;
                        *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                        *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                        *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                        *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                      }
                      else {
                        (*pGVar3->intersectionFilterN)(&local_1138);
                        auVar97 = ZEXT1664(local_1198);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar78 = ZEXT1664(auVar47);
                        auVar111 = ZEXT1664(local_10d8);
                        auVar110 = ZEXT1664(local_10c8);
                        auVar109 = ZEXT1664(local_10b8);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar108 = ZEXT1664(auVar47);
                        auVar47 = vxorps_avx512vl(auVar48,auVar48);
                        auVar107 = ZEXT1664(auVar47);
                        context = local_11b8;
                        pSVar32 = local_11b0;
                        uVar33 = local_11c8;
                        if (*local_1138.valid != 0) goto LAB_01f4aa00;
LAB_01f4aad3:
                        (ray->super_RayK<1>).tfar = (float)local_11a8;
                        fVar89 = (float)local_11a8;
                      }
                      fVar92 = (ray->super_RayK<1>).tfar;
                      auVar20._4_4_ = fVar92;
                      auVar20._0_4_ = fVar92;
                      auVar20._8_4_ = fVar92;
                      auVar20._12_4_ = fVar92;
                      uVar8 = vcmpps_avx512vl(auVar97._0_16_,auVar20,2);
                      bVar22 = ~(byte)(1 << ((uint)uVar24 & 0x1f)) & (byte)uVar43 & (byte)uVar8;
                      auVar47 = ZEXT416((uint)fVar89);
                      goto LAB_01f4a840;
                    }
                    bVar6 = false;
                  }
                  if (!bVar6) {
                    fVar89 = *(float *)(local_1058 + uVar24 * 4);
                    fVar92 = *(float *)(local_1048 + uVar24 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar24 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + uVar24 * 4);
                    (ray->Ng).field_0.field_0.y = local_1008[uVar24 - 4];
                    (ray->Ng).field_0.field_0.z = local_1008[uVar24];
                    ray->u = fVar89;
                    ray->v = fVar92;
                    ray->primID = *(uint *)((long)&local_10a8 + uVar24 * 4);
                    ray->geomID = uVar26;
                    pRVar5 = context->user;
                    ray->instID[0] = pRVar5->instID[0];
                    ray->instPrimID[0] = pRVar5->instPrimID[0];
                    break;
                  }
                  bVar22 = (byte)uVar43;
                  if (bVar22 == 0) break;
                  auVar48 = vblendmps_avx512vl(auVar78._0_16_,auVar97._0_16_);
                  auVar73._0_4_ =
                       (uint)(bVar22 & 1) * auVar48._0_4_ |
                       (uint)!(bool)(bVar22 & 1) * auVar47._0_4_;
                  bVar6 = (bool)((byte)(uVar43 >> 1) & 1);
                  auVar73._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                  bVar6 = (bool)((byte)(uVar43 >> 2) & 1);
                  auVar73._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                  auVar73._12_4_ =
                       (uVar43 >> 3) * auVar48._12_4_ | (uint)!SUB41(uVar43 >> 3,0) * auVar47._12_4_
                  ;
                  auVar47 = vshufps_avx(auVar73,auVar73,0xb1);
                  auVar47 = vminps_avx(auVar47,auVar73);
                  auVar48 = vshufpd_avx(auVar47,auVar47,1);
                  auVar47 = vminps_avx(auVar48,auVar47);
                  uVar8 = vcmpps_avx512vl(auVar73,auVar47,0);
                  bVar22 = (byte)uVar8 & bVar22;
                  uVar26 = uVar43;
                  if (bVar22 != 0) {
                    uVar26 = (uint)bVar22;
                  }
                  uVar11 = 0;
                  for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                    uVar11 = uVar11 + 1;
                  }
                  uVar24 = (ulong)uVar11;
                } while( true );
              }
            }
            local_1140 = local_1140 + 1;
          } while (local_1140 != local_1148);
        }
        fVar89 = (ray->super_RayK<1>).tfar;
        auVar78 = ZEXT1664(CONCAT412(fVar89,CONCAT48(fVar89,CONCAT44(fVar89,fVar89))));
        auVar97 = ZEXT1664(local_fa8);
        auVar98 = ZEXT1664(local_fb8);
        auVar103 = ZEXT1664(local_fd8);
        auVar105 = ZEXT1664(local_fe8);
        auVar106 = ZEXT1664(local_ff8);
        lVar28 = local_1160;
        lVar27 = local_1180;
        in_R8 = local_11c0;
        lVar25 = local_1158;
        lVar37 = local_1170;
        lVar39 = local_1178;
        lVar41 = local_1168;
        fVar89 = local_f98;
        fVar92 = fStack_f94;
        fVar93 = fStack_f90;
        fVar94 = fStack_f8c;
        fVar99 = local_fc8;
        fVar100 = fStack_fc4;
        fVar101 = fStack_fc0;
        fVar102 = fStack_fbc;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }